

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_subset_html_actions::module_start(module_subset_html_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  <h2 id=\"subset-");
  poVar1 = std::operator<<(poVar1,(string *)module);
  poVar1 = std::operator<<(poVar1,"\"><a href=\"");
  poVar1 = std::operator<<(poVar1,(string *)module);
  poVar1 = std::operator<<(poVar1,".html\"><em>");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"</em></a></h2><ul>\n");
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "  <h2 id=\"subset-" << module << "\"><a href=\"" << module << ".html\"><em>" << module << "</em></a></h2><ul>\n";
    }